

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::MemberAccessExpression>
          (SequenceMethodExprVisitor *this,MemberAccessExpression *expr)

{
  SourceRange sourceRange;
  bool bVar1;
  Symbol *this_00;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  DiagCode unaff_retaddr;
  bool in_stack_00000017;
  Expression *in_stack_00000018;
  Symbol *sym;
  Diagnostic *in_stack_ffffffffffffffd0;
  SourceLocation SVar2;
  
  if ((*(int *)in_RSI != 8) ||
     (SVar2 = in_RDI, this_00 = Expression::getSymbolReference(in_stack_00000018,in_stack_00000017),
     this_00 == (Symbol *)0x0)) goto LAB_009650dc;
  if (this_00->kind != LocalAssertionVar) {
    if (this_00->kind != AssertionPort) goto LAB_009650dc;
    Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x96507f);
    bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0x965087);
    if (!bVar1) goto LAB_009650dc;
  }
  in_stack_ffffffffffffffd0 = *(Diagnostic **)((long)in_RSI + 0x20);
  sourceRange.endLoc = SVar2;
  sourceRange.startLoc = in_RSI;
  ASTContext::addDiag((ASTContext *)this_00,unaff_retaddr,sourceRange);
  Diagnostic::operator<<(in_stack_ffffffffffffffd0,(string *)in_RDI);
LAB_009650dc:
  MemberAccessExpression::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
            ((MemberAccessExpression *)in_stack_ffffffffffffffd0,(SequenceMethodExprVisitor *)in_RDI
            );
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (HasVisitExprs<T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }